

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerMSL::emit_glsl_op
          (CompilerMSL *this,uint32_t result_type,uint32_t id,uint32_t eop,uint32_t *args,
          uint32_t count)

{
  StorageClass SVar1;
  Variant *pVVar2;
  undefined1 *puVar3;
  string *psVar4;
  byte bVar5;
  bool bVar6;
  uint32_t uVar7;
  BaseType input_type;
  BaseType BVar8;
  GLSLstd450 GVar9;
  uint32_t uVar10;
  ulong uVar11;
  SPIRExpression *pSVar12;
  mapped_type *pmVar13;
  SPIRType *pSVar14;
  char *pcVar15;
  SPIRConstant *pSVar16;
  SPIRVariable *pSVar17;
  uint *ts_1;
  _Alloc_hider _Var18;
  char (*ts_2) [3];
  uint32_t op2;
  __node_gen_type __node_gen;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  ts_2 = (char (*) [3])args;
  uVar7 = CompilerGLSL::get_integer_width_for_glsl_instruction
                    (&this->super_CompilerGLSL,eop,args,count);
  input_type = to_signed_basetype(uVar7);
  BVar8 = to_unsigned_basetype(uVar7);
  GVar9 = CompilerGLSL::get_remapped_glsl_op(&this->super_CompilerGLSL,eop);
  ts_1 = &switchD_002b7890::switchdataD_0034f7c0;
  switch(GVar9) {
  case GLSLstd450RoundEven:
    uVar7 = *args;
    pcVar15 = "rint";
    break;
  default:
    goto switchD_002b7890_caseD_3;
  case GLSLstd450Sinh:
    uVar7 = *args;
    pcVar15 = "fast::sinh";
    break;
  case GLSLstd450Cosh:
    uVar7 = *args;
    pcVar15 = "fast::cosh";
    break;
  case GLSLstd450Tanh:
    uVar7 = *args;
    pcVar15 = "precise::tanh";
    break;
  case GLSLstd450Atan2:
    uVar7 = *args;
    uVar10 = args[1];
    pcVar15 = "precise::atan2";
    goto LAB_002b7fa0;
  case GLSLstd450InverseSqrt:
    uVar7 = *args;
    pcVar15 = "rsqrt";
    break;
  case GLSLstd450MatrixInverse:
    pSVar14 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + result_type);
    uVar7 = pSVar14->columns;
    if (uVar7 == 4) {
      uVar7 = *args;
      pcVar15 = "spvInverse4x4";
    }
    else if (uVar7 == 3) {
      uVar7 = *args;
      pcVar15 = "spvInverse3x3";
    }
    else {
      if (uVar7 != 2) {
        return;
      }
      uVar7 = *args;
      pcVar15 = "spvInverse2x2";
    }
    break;
  case GLSLstd450Modf:
  case GLSLstd450Frexp:
    uVar11 = (ulong)args[1];
    if ((uVar11 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                  super_VectorView<spirv_cross::Variant>.buffer_size) &&
       (pVVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                 super_VectorView<spirv_cross::Variant>.ptr, pVVar2[uVar11].type == TypeExpression))
    {
      pSVar12 = Variant::get<spirv_cross::SPIRExpression>(pVVar2 + uVar11);
    }
    else {
      pSVar12 = (SPIRExpression *)0x0;
    }
    pSVar14 = Compiler::expression_type((Compiler *)this,args[1]);
    SVar1 = pSVar14->storage;
    bVar5 = (byte)(0x1ca >> ((byte)SVar1 & 0x1f)) & SVar1 < StorageClassPushConstant;
    if (SVar1 == StorageClassOutput) {
      bVar5 = bVar5 & (this->capture_output_to_buffer ^ 1U);
    }
    if (bVar5 == 0) {
LAB_002b7924:
      CompilerGLSL::register_call_out_argument(&this->super_CompilerGLSL,args[1]);
      local_b0._M_dataplus._M_p =
           (pointer)&(this->super_CompilerGLSL).super_Compiler.forced_temporaries;
      ::std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)local_b0._M_dataplus._M_p,&stack0xffffffffffffff28);
      pmVar13 = ::std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&(this->super_CompilerGLSL).extra_sub_expressions,
                             (key_type *)&stack0xffffffffffffff28);
      if (*pmVar13 == 0) {
        uVar7 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
        *pmVar13 = uVar7;
      }
      uVar7 = Compiler::expression_type_id((Compiler *)this,args[1]);
      uVar7 = Compiler::get_pointee_type_id((Compiler *)this,uVar7);
      CompilerGLSL::emit_uninitialized_temporary_expression
                (&this->super_CompilerGLSL,uVar7,*pmVar13);
      pcVar15 = "frexp";
      if (eop == 0x23) {
        pcVar15 = "modf";
      }
      CompilerGLSL::emit_binary_func_op
                (&this->super_CompilerGLSL,result_type,id,*args,*pmVar13,pcVar15);
      CompilerGLSL::to_expression_abi_cxx11_(&local_b0,&this->super_CompilerGLSL,args[1],true);
      CompilerGLSL::to_expression_abi_cxx11_(&local_d0,&this->super_CompilerGLSL,*pmVar13,true);
      CompilerGLSL::
      statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                (&this->super_CompilerGLSL,&local_b0,(char (*) [4])0x35ef26,&local_d0,
                 (char (*) [2])0x347553);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      goto LAB_002b7c3a;
    }
    if ((pSVar12 != (SPIRExpression *)0x0) && (pSVar12->access_chain == true)) {
      pSVar14 = Compiler::expression_type((Compiler *)this,args[1]);
      bVar6 = Compiler::is_scalar((Compiler *)this,pSVar14);
      if (bVar6) goto LAB_002b7924;
    }
    goto switchD_002b7890_caseD_3;
  case GLSLstd450FMin:
    pSVar14 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + result_type);
    uVar7 = *args;
    uVar10 = args[1];
    if (*(int *)&(pSVar14->super_IVariant).field_0xc == 0xd) {
      pcVar15 = "fast::min";
      goto LAB_002b7fa0;
    }
    goto LAB_002b7e09;
  case GLSLstd450FMax:
    pSVar14 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + result_type);
    uVar7 = *args;
    uVar10 = args[1];
    if (*(int *)&(pSVar14->super_IVariant).field_0xc == 0xd) {
      pcVar15 = "fast::max";
      goto LAB_002b7fa0;
    }
    goto LAB_002b7f94;
  case GLSLstd450FClamp:
    pSVar14 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + result_type);
    uVar7 = *args;
    uVar10 = args[1];
    op2 = args[2];
    if (*(int *)&(pSVar14->super_IVariant).field_0xc == 0xd) {
      pcVar15 = "fast::clamp";
      goto LAB_002b8081;
    }
    goto LAB_002b807a;
  case GLSLstd450PackSnorm4x8:
    uVar7 = *args;
    pcVar15 = "pack_float_to_snorm4x8";
    break;
  case GLSLstd450PackUnorm4x8:
    uVar7 = *args;
    pcVar15 = "pack_float_to_unorm4x8";
    break;
  case GLSLstd450PackSnorm2x16:
    uVar7 = *args;
    pcVar15 = "pack_float_to_snorm2x16";
    break;
  case GLSLstd450PackUnorm2x16:
    uVar7 = *args;
    pcVar15 = "pack_float_to_unorm2x16";
    break;
  case GLSLstd450PackHalf2x16:
    CompilerGLSL::to_expression_abi_cxx11_(&local_d0,&this->super_CompilerGLSL,*args,true);
    join<char_const(&)[21],std::__cxx11::string,char_const(&)[3]>
              (&local_b0,(spirv_cross *)"as_type<uint>(half2(",(char (*) [21])&local_d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x35a327,ts_2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    uVar7 = id;
    bVar6 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,id,&local_b0,bVar6,false);
    Compiler::inherit_expression_dependencies((Compiler *)this,uVar7,*args);
    goto LAB_002b7c3a;
  case GLSLstd450PackDouble2x32:
    uVar7 = *args;
    pcVar15 = "unsupported_GLSLstd450PackDouble2x32";
    break;
  case GLSLstd450UnpackSnorm2x16:
    uVar7 = *args;
    pcVar15 = "unpack_snorm2x16_to_float";
    break;
  case GLSLstd450UnpackUnorm2x16:
    uVar7 = *args;
    pcVar15 = "unpack_unorm2x16_to_float";
    break;
  case GLSLstd450UnpackHalf2x16:
    CompilerGLSL::to_expression_abi_cxx11_(&local_d0,&this->super_CompilerGLSL,*args,true);
    join<char_const(&)[23],std::__cxx11::string,char_const(&)[3]>
              (&local_b0,(spirv_cross *)"float2(as_type<half2>(",(char (*) [23])&local_d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x35a327,ts_2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    uVar7 = id;
    bVar6 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,id,&local_b0,bVar6,false);
    Compiler::inherit_expression_dependencies((Compiler *)this,uVar7,*args);
LAB_002b7c3a:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
      return;
    }
LAB_002b882e:
    operator_delete(local_b0._M_dataplus._M_p);
    return;
  case GLSLstd450UnpackSnorm4x8:
    uVar7 = *args;
    pcVar15 = "unpack_snorm4x8_to_float";
    break;
  case GLSLstd450UnpackUnorm4x8:
    uVar7 = *args;
    pcVar15 = "unpack_unorm4x8_to_float";
    break;
  case GLSLstd450UnpackDouble2x32:
    uVar7 = *args;
    pcVar15 = "unsupported_GLSLstd450UnpackDouble2x32";
    break;
  case GLSLstd450Length:
    pSVar14 = Compiler::expression_type((Compiler *)this,*args);
    if (pSVar14->vecsize != 1) goto LAB_002b7ff4;
    uVar7 = *args;
    pcVar15 = "abs";
    break;
  case GLSLstd450Distance:
    pSVar14 = Compiler::expression_type((Compiler *)this,*args);
    if (pSVar14->vecsize == 1) {
      uVar7 = id;
      CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
                (&local_d0,&this->super_CompilerGLSL,*args,true);
      CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
                (&local_90,&this->super_CompilerGLSL,args[1],true);
      join<char_const(&)[5],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                (&local_b0,(spirv_cross *)"abs(",(char (*) [5])&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x34cf71,
                 (char (*) [4])&local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3482a8,
                 (char (*) [2])in_stack_ffffffffffffff18);
      bVar6 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
      if (bVar6) {
        bVar6 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,args[1]);
      }
      else {
        bVar6 = false;
      }
      CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,id,&local_b0,bVar6,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      Compiler::inherit_expression_dependencies((Compiler *)this,uVar7,*args);
      Compiler::inherit_expression_dependencies((Compiler *)this,uVar7,args[1]);
      return;
    }
    goto LAB_002b7ff4;
  case GLSLstd450Normalize:
    pSVar14 = Compiler::expression_type((Compiler *)this,*args);
    if (pSVar14->vecsize == 1) {
      uVar7 = *args;
      pcVar15 = "sign";
    }
    else {
      uVar7 = *args;
      if ((pSVar14->vecsize < 4) && (*(int *)&(pSVar14->super_IVariant).field_0xc == 0xc)) {
        pcVar15 = "normalize";
      }
      else {
        pcVar15 = "fast::normalize";
      }
    }
    break;
  case GLSLstd450FaceForward:
    pSVar14 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + result_type);
    if (pSVar14->vecsize == 1) {
      uVar7 = *args;
      uVar10 = args[1];
      op2 = args[2];
      pcVar15 = "spvFaceForward";
      goto LAB_002b8081;
    }
    goto LAB_002b7ff4;
  case GLSLstd450Reflect:
    pSVar14 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + result_type);
    if (pSVar14->vecsize == 1) {
      uVar7 = *args;
      uVar10 = args[1];
      pcVar15 = "spvReflect";
      goto LAB_002b7fa0;
    }
    goto LAB_002b7ff4;
  case GLSLstd450Refract:
    pSVar14 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + result_type);
    if (pSVar14->vecsize == 1) {
      uVar7 = *args;
      uVar10 = args[1];
      op2 = args[2];
      pcVar15 = "spvRefract";
      goto LAB_002b8081;
    }
LAB_002b7ff4:
    CompilerGLSL::emit_glsl_op(&this->super_CompilerGLSL,result_type,id,eop,args,count);
    return;
  case GLSLstd450FindILsb:
    pSVar14 = Compiler::expression_type((Compiler *)this,*args);
    input_type = *(BaseType *)&(pSVar14->super_IVariant).field_0xc;
    uVar7 = *args;
    pcVar15 = "spvFindLSB";
    goto LAB_002b803b;
  case GLSLstd450FindSMsb:
    uVar7 = *args;
    pcVar15 = "spvFindSMSB";
    goto LAB_002b803b;
  case GLSLstd450FindUMsb:
    uVar7 = *args;
    pcVar15 = "spvFindUMSB";
    input_type = BVar8;
LAB_002b803b:
    CompilerGLSL::emit_unary_func_op_cast
              (&this->super_CompilerGLSL,result_type,id,uVar7,pcVar15,input_type,input_type);
    return;
  case GLSLstd450InterpolateAtCentroid:
    uVar7 = Compiler::get_extended_decoration
                      ((Compiler *)this,*args,SPIRVCrossDecorationInterfaceMemberIndex);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    bVar6 = Compiler::has_extended_decoration
                      ((Compiler *)this,*args,SPIRVCrossDecorationInterpolantComponentExpr);
    if (bVar6) {
      uVar10 = Compiler::get_extended_decoration
                         ((Compiler *)this,*args,SPIRVCrossDecorationInterpolantComponentExpr);
      uVar11 = (ulong)uVar10;
      if ((uVar11 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                    super_VectorView<spirv_cross::Variant>.buffer_size) &&
         (ts_1 = (uint *)(this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr,
         ((Variant *)((long)ts_1 + uVar11 * 0x18))->type == TypeConstant)) {
        pSVar16 = Variant::get<spirv_cross::SPIRConstant>((Variant *)((long)ts_1 + uVar11 * 0x18));
      }
      else {
        pSVar16 = (SPIRConstant *)0x0;
      }
      if ((pSVar16 == (SPIRConstant *)0x0) || (pSVar16->specialization == true)) {
        CompilerGLSL::to_expression_abi_cxx11_(&local_90,&this->super_CompilerGLSL,uVar10,true);
        join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  (&local_d0,(spirv_cross *)0x3464bc,(char (*) [2])&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x33ea72,
                   (char (*) [2])ts_2);
        ::std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        psVar4 = &local_90;
        local_d0._M_dataplus._M_p = local_90._M_dataplus._M_p;
      }
      else {
        local_90._M_dataplus._M_p =
             CompilerGLSL::index_to_swizzle(&this->super_CompilerGLSL,(pSVar16->m).c[0].r[0].u32);
        join<char_const(&)[2],char_const*>
                  (&local_d0,(spirv_cross *)0x348038,(char (*) [2])&local_90,(char **)ts_1);
        ::std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_d0);
        psVar4 = &local_d0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &psVar4->field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
    }
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&local_90,this,(ulong)(this->stage_in_var_id).id,1);
    pSVar17 = Variant::get<spirv_cross::SPIRVariable>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + (this->stage_in_var_id).id);
    pSVar14 = Compiler::get_variable_data_type((Compiler *)this,pSVar17);
    CompilerGLSL::to_member_name_abi_cxx11_(&local_70,&this->super_CompilerGLSL,pSVar14,uVar7);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[27],std::__cxx11::string&>
              (&local_d0,(spirv_cross *)&local_90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x348038,
               (char (*) [2])&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ".interpolate_at_centroid()",(char (*) [27])&local_b0,in_stack_ffffffffffffff18);
    bVar6 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,id,&local_d0,bVar6,false);
    psVar4 = &local_d0;
    goto LAB_002b87ed;
  case GLSLstd450InterpolateAtSample:
    uVar7 = Compiler::get_extended_decoration
                      ((Compiler *)this,*args,SPIRVCrossDecorationInterfaceMemberIndex);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    bVar6 = Compiler::has_extended_decoration
                      ((Compiler *)this,*args,SPIRVCrossDecorationInterpolantComponentExpr);
    if (bVar6) {
      uVar10 = Compiler::get_extended_decoration
                         ((Compiler *)this,*args,SPIRVCrossDecorationInterpolantComponentExpr);
      uVar11 = (ulong)uVar10;
      if ((uVar11 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                    super_VectorView<spirv_cross::Variant>.buffer_size) &&
         (ts_1 = (uint *)(this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr,
         ((Variant *)((long)ts_1 + uVar11 * 0x18))->type == TypeConstant)) {
        pSVar16 = Variant::get<spirv_cross::SPIRConstant>((Variant *)((long)ts_1 + uVar11 * 0x18));
      }
      else {
        pSVar16 = (SPIRConstant *)0x0;
      }
      if ((pSVar16 == (SPIRConstant *)0x0) || (pSVar16->specialization == true)) {
        CompilerGLSL::to_expression_abi_cxx11_(&local_90,&this->super_CompilerGLSL,uVar10,true);
        join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  (&local_d0,(spirv_cross *)0x3464bc,(char (*) [2])&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x33ea72,
                   (char (*) [2])ts_2);
        ::std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        psVar4 = &local_90;
        _Var18._M_p = local_90._M_dataplus._M_p;
      }
      else {
        local_90._M_dataplus._M_p =
             CompilerGLSL::index_to_swizzle(&this->super_CompilerGLSL,(pSVar16->m).c[0].r[0].u32);
        join<char_const(&)[2],char_const*>
                  (&local_d0,(spirv_cross *)0x348038,(char (*) [2])&local_90,(char **)ts_1);
        ::std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_d0);
        psVar4 = &local_d0;
        _Var18._M_p = local_d0._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var18._M_p != &psVar4->field_2) {
        operator_delete(_Var18._M_p);
      }
    }
    uVar10 = id;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&local_90,this,(ulong)(this->stage_in_var_id).id,1);
    pSVar17 = Variant::get<spirv_cross::SPIRVariable>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + (this->stage_in_var_id).id);
    pSVar14 = Compiler::get_variable_data_type((Compiler *)this,pSVar17);
    CompilerGLSL::to_member_name_abi_cxx11_(&local_70,&this->super_CompilerGLSL,pSVar14,uVar7);
    CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,args[1],true);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[24],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
              (&local_d0,(spirv_cross *)&local_90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x348038,
               (char (*) [2])&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ".interpolate_at_sample(",(char (*) [24])&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3482a8,
               (char (*) [2])&local_b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(result_type,uVar10));
    bVar6 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    if (bVar6) {
      bVar6 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,args[1]);
    }
    else {
      bVar6 = false;
    }
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,id,&local_d0,bVar6,false);
    goto LAB_002b87d2;
  case GLSLstd450InterpolateAtOffset:
    uVar7 = Compiler::get_extended_decoration
                      ((Compiler *)this,*args,SPIRVCrossDecorationInterfaceMemberIndex);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    bVar6 = Compiler::has_extended_decoration
                      ((Compiler *)this,*args,SPIRVCrossDecorationInterpolantComponentExpr);
    if (bVar6) {
      uVar10 = Compiler::get_extended_decoration
                         ((Compiler *)this,*args,SPIRVCrossDecorationInterpolantComponentExpr);
      uVar11 = (ulong)uVar10;
      if ((uVar11 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                    super_VectorView<spirv_cross::Variant>.buffer_size) &&
         (ts_1 = (uint *)(this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr,
         ((Variant *)((long)ts_1 + uVar11 * 0x18))->type == TypeConstant)) {
        pSVar16 = Variant::get<spirv_cross::SPIRConstant>((Variant *)((long)ts_1 + uVar11 * 0x18));
      }
      else {
        pSVar16 = (SPIRConstant *)0x0;
      }
      if ((pSVar16 == (SPIRConstant *)0x0) || (pSVar16->specialization == true)) {
        CompilerGLSL::to_expression_abi_cxx11_(&local_90,&this->super_CompilerGLSL,uVar10,true);
        join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  (&local_d0,(spirv_cross *)0x3464bc,(char (*) [2])&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x33ea72,
                   (char (*) [2])ts_2);
        ::std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        psVar4 = &local_90;
        _Var18._M_p = local_90._M_dataplus._M_p;
      }
      else {
        local_90._M_dataplus._M_p =
             CompilerGLSL::index_to_swizzle(&this->super_CompilerGLSL,(pSVar16->m).c[0].r[0].u32);
        join<char_const(&)[2],char_const*>
                  (&local_d0,(spirv_cross *)0x348038,(char (*) [2])&local_90,(char **)ts_1);
        ::std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_d0);
        psVar4 = &local_d0;
        _Var18._M_p = local_d0._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var18._M_p != &psVar4->field_2) {
        operator_delete(_Var18._M_p);
      }
    }
    uVar10 = id;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&local_90,this,(ulong)(this->stage_in_var_id).id,1);
    pSVar17 = Variant::get<spirv_cross::SPIRVariable>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + (this->stage_in_var_id).id);
    pSVar14 = Compiler::get_variable_data_type((Compiler *)this,pSVar17);
    CompilerGLSL::to_member_name_abi_cxx11_(&local_70,&this->super_CompilerGLSL,pSVar14,uVar7);
    CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,args[1],true);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[24],std::__cxx11::string,char_const(&)[11],std::__cxx11::string&>
              (&local_d0,(spirv_cross *)&local_90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x348038,
               (char (*) [2])&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ".interpolate_at_offset(",(char (*) [24])&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" + 0.4375)",
               (char (*) [11])&local_b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(result_type,uVar10));
    bVar6 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    if (bVar6) {
      bVar6 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,args[1]);
    }
    else {
      bVar6 = false;
    }
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,id,&local_d0,bVar6,false);
LAB_002b87d2:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    psVar4 = &local_50;
LAB_002b87ed:
    puVar3 = *(undefined1 **)((psVar4->field_2)._M_local_buf + -0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar3 != &psVar4->field_2) {
      operator_delete(puVar3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
      return;
    }
    goto LAB_002b882e;
  case GLSLstd450NMin:
    pSVar14 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + result_type);
    uVar7 = *args;
    uVar10 = args[1];
    if (*(int *)&(pSVar14->super_IVariant).field_0xc == 0xd) {
      pcVar15 = "precise::min";
      goto LAB_002b7fa0;
    }
LAB_002b7e09:
    pcVar15 = "min";
LAB_002b7fa0:
    CompilerGLSL::emit_binary_func_op(&this->super_CompilerGLSL,result_type,id,uVar7,uVar10,pcVar15)
    ;
    return;
  case GLSLstd450NMax:
    pSVar14 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + result_type);
    uVar7 = *args;
    uVar10 = args[1];
    if (*(int *)&(pSVar14->super_IVariant).field_0xc == 0xd) {
      pcVar15 = "precise::max";
      goto LAB_002b7fa0;
    }
LAB_002b7f94:
    pcVar15 = "max";
    goto LAB_002b7fa0;
  case GLSLstd450NClamp:
    pSVar14 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + result_type);
    uVar7 = *args;
    uVar10 = args[1];
    op2 = args[2];
    if (*(int *)&(pSVar14->super_IVariant).field_0xc == 0xd) {
      pcVar15 = "precise::clamp";
      goto LAB_002b8081;
    }
LAB_002b807a:
    pcVar15 = "clamp";
LAB_002b8081:
    CompilerGLSL::emit_trinary_func_op
              (&this->super_CompilerGLSL,result_type,id,uVar7,uVar10,op2,pcVar15);
    return;
  }
  CompilerGLSL::emit_unary_func_op(&this->super_CompilerGLSL,result_type,id,uVar7,pcVar15);
  return;
switchD_002b7890_caseD_3:
  goto LAB_002b7ff4;
}

Assistant:

void CompilerMSL::emit_glsl_op(uint32_t result_type, uint32_t id, uint32_t eop, const uint32_t *args, uint32_t count)
{
	auto op = static_cast<GLSLstd450>(eop);

	// If we need to do implicit bitcasts, make sure we do it with the correct type.
	uint32_t integer_width = get_integer_width_for_glsl_instruction(op, args, count);
	auto int_type = to_signed_basetype(integer_width);
	auto uint_type = to_unsigned_basetype(integer_width);

	op = get_remapped_glsl_op(op);

	switch (op)
	{
	case GLSLstd450Sinh:
		emit_unary_func_op(result_type, id, args[0], "fast::sinh");
		break;
	case GLSLstd450Cosh:
		emit_unary_func_op(result_type, id, args[0], "fast::cosh");
		break;
	case GLSLstd450Tanh:
		emit_unary_func_op(result_type, id, args[0], "precise::tanh");
		break;
	case GLSLstd450Atan2:
		emit_binary_func_op(result_type, id, args[0], args[1], "precise::atan2");
		break;
	case GLSLstd450InverseSqrt:
		emit_unary_func_op(result_type, id, args[0], "rsqrt");
		break;
	case GLSLstd450RoundEven:
		emit_unary_func_op(result_type, id, args[0], "rint");
		break;

	case GLSLstd450FindILsb:
	{
		// In this template version of findLSB, we return T.
		auto basetype = expression_type(args[0]).basetype;
		emit_unary_func_op_cast(result_type, id, args[0], "spvFindLSB", basetype, basetype);
		break;
	}

	case GLSLstd450FindSMsb:
		emit_unary_func_op_cast(result_type, id, args[0], "spvFindSMSB", int_type, int_type);
		break;

	case GLSLstd450FindUMsb:
		emit_unary_func_op_cast(result_type, id, args[0], "spvFindUMSB", uint_type, uint_type);
		break;

	case GLSLstd450PackSnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "pack_float_to_snorm4x8");
		break;
	case GLSLstd450PackUnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "pack_float_to_unorm4x8");
		break;
	case GLSLstd450PackSnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "pack_float_to_snorm2x16");
		break;
	case GLSLstd450PackUnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "pack_float_to_unorm2x16");
		break;

	case GLSLstd450PackHalf2x16:
	{
		auto expr = join("as_type<uint>(half2(", to_expression(args[0]), "))");
		emit_op(result_type, id, expr, should_forward(args[0]));
		inherit_expression_dependencies(id, args[0]);
		break;
	}

	case GLSLstd450UnpackSnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "unpack_snorm4x8_to_float");
		break;
	case GLSLstd450UnpackUnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "unpack_unorm4x8_to_float");
		break;
	case GLSLstd450UnpackSnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "unpack_snorm2x16_to_float");
		break;
	case GLSLstd450UnpackUnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "unpack_unorm2x16_to_float");
		break;

	case GLSLstd450UnpackHalf2x16:
	{
		auto expr = join("float2(as_type<half2>(", to_expression(args[0]), "))");
		emit_op(result_type, id, expr, should_forward(args[0]));
		inherit_expression_dependencies(id, args[0]);
		break;
	}

	case GLSLstd450PackDouble2x32:
		emit_unary_func_op(result_type, id, args[0], "unsupported_GLSLstd450PackDouble2x32"); // Currently unsupported
		break;
	case GLSLstd450UnpackDouble2x32:
		emit_unary_func_op(result_type, id, args[0], "unsupported_GLSLstd450UnpackDouble2x32"); // Currently unsupported
		break;

	case GLSLstd450MatrixInverse:
	{
		auto &mat_type = get<SPIRType>(result_type);
		switch (mat_type.columns)
		{
		case 2:
			emit_unary_func_op(result_type, id, args[0], "spvInverse2x2");
			break;
		case 3:
			emit_unary_func_op(result_type, id, args[0], "spvInverse3x3");
			break;
		case 4:
			emit_unary_func_op(result_type, id, args[0], "spvInverse4x4");
			break;
		default:
			break;
		}
		break;
	}

	case GLSLstd450FMin:
		// If the result type isn't float, don't bother calling the specific
		// precise::/fast:: version. Metal doesn't have those for half and
		// double types.
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_binary_func_op(result_type, id, args[0], args[1], "min");
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "fast::min");
		break;

	case GLSLstd450FMax:
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_binary_func_op(result_type, id, args[0], args[1], "max");
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "fast::max");
		break;

	case GLSLstd450FClamp:
		// TODO: If args[1] is 0 and args[2] is 1, emit a saturate() call.
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "clamp");
		else
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "fast::clamp");
		break;

	case GLSLstd450NMin:
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_binary_func_op(result_type, id, args[0], args[1], "min");
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "precise::min");
		break;

	case GLSLstd450NMax:
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_binary_func_op(result_type, id, args[0], args[1], "max");
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "precise::max");
		break;

	case GLSLstd450NClamp:
		// TODO: If args[1] is 0 and args[2] is 1, emit a saturate() call.
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "clamp");
		else
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "precise::clamp");
		break;

	case GLSLstd450InterpolateAtCentroid:
	{
		// We can't just emit the expression normally, because the qualified name contains a call to the default
		// interpolate method, or refers to a local variable. We saved the interface index we need; use it to construct
		// the base for the method call.
		uint32_t interface_index = get_extended_decoration(args[0], SPIRVCrossDecorationInterfaceMemberIndex);
		string component;
		if (has_extended_decoration(args[0], SPIRVCrossDecorationInterpolantComponentExpr))
		{
			uint32_t index_expr = get_extended_decoration(args[0], SPIRVCrossDecorationInterpolantComponentExpr);
			auto *c = maybe_get<SPIRConstant>(index_expr);
			if (!c || c->specialization)
				component = join("[", to_expression(index_expr), "]");
			else
				component = join(".", index_to_swizzle(c->scalar()));
		}
		emit_op(result_type, id,
		        join(to_name(stage_in_var_id), ".", to_member_name(get_stage_in_struct_type(), interface_index),
		             ".interpolate_at_centroid()", component),
		        should_forward(args[0]));
		break;
	}

	case GLSLstd450InterpolateAtSample:
	{
		uint32_t interface_index = get_extended_decoration(args[0], SPIRVCrossDecorationInterfaceMemberIndex);
		string component;
		if (has_extended_decoration(args[0], SPIRVCrossDecorationInterpolantComponentExpr))
		{
			uint32_t index_expr = get_extended_decoration(args[0], SPIRVCrossDecorationInterpolantComponentExpr);
			auto *c = maybe_get<SPIRConstant>(index_expr);
			if (!c || c->specialization)
				component = join("[", to_expression(index_expr), "]");
			else
				component = join(".", index_to_swizzle(c->scalar()));
		}
		emit_op(result_type, id,
		        join(to_name(stage_in_var_id), ".", to_member_name(get_stage_in_struct_type(), interface_index),
		             ".interpolate_at_sample(", to_expression(args[1]), ")", component),
		        should_forward(args[0]) && should_forward(args[1]));
		break;
	}

	case GLSLstd450InterpolateAtOffset:
	{
		uint32_t interface_index = get_extended_decoration(args[0], SPIRVCrossDecorationInterfaceMemberIndex);
		string component;
		if (has_extended_decoration(args[0], SPIRVCrossDecorationInterpolantComponentExpr))
		{
			uint32_t index_expr = get_extended_decoration(args[0], SPIRVCrossDecorationInterpolantComponentExpr);
			auto *c = maybe_get<SPIRConstant>(index_expr);
			if (!c || c->specialization)
				component = join("[", to_expression(index_expr), "]");
			else
				component = join(".", index_to_swizzle(c->scalar()));
		}
		// Like Direct3D, Metal puts the (0, 0) at the upper-left corner, not the center as SPIR-V and GLSL do.
		// Offset the offset by (1/2 - 1/16), or 0.4375, to compensate for this.
		// It has to be (1/2 - 1/16) and not 1/2, or several CTS tests subtly break on Intel.
		emit_op(result_type, id,
		        join(to_name(stage_in_var_id), ".", to_member_name(get_stage_in_struct_type(), interface_index),
		             ".interpolate_at_offset(", to_expression(args[1]), " + 0.4375)", component),
		        should_forward(args[0]) && should_forward(args[1]));
		break;
	}

	case GLSLstd450Distance:
		// MSL does not support scalar versions here.
		if (expression_type(args[0]).vecsize == 1)
		{
			// Equivalent to length(a - b) -> abs(a - b).
			emit_op(result_type, id,
			        join("abs(", to_enclosed_unpacked_expression(args[0]), " - ",
			             to_enclosed_unpacked_expression(args[1]), ")"),
			        should_forward(args[0]) && should_forward(args[1]));
			inherit_expression_dependencies(id, args[0]);
			inherit_expression_dependencies(id, args[1]);
		}
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Length:
		// MSL does not support scalar versions, so use abs().
		if (expression_type(args[0]).vecsize == 1)
			emit_unary_func_op(result_type, id, args[0], "abs");
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Normalize:
	{
		auto &exp_type = expression_type(args[0]);
		// MSL does not support scalar versions here.
		// MSL has no implementation for normalize in the fast:: namespace for half2 and half3
		// Returns -1 or 1 for valid input, sign() does the job.
		if (exp_type.vecsize == 1)
			emit_unary_func_op(result_type, id, args[0], "sign");
		else if (exp_type.vecsize <= 3 && exp_type.basetype == SPIRType::Half)
			emit_unary_func_op(result_type, id, args[0], "normalize");
		else
			emit_unary_func_op(result_type, id, args[0], "fast::normalize");
		break;
	}
	case GLSLstd450Reflect:
		if (get<SPIRType>(result_type).vecsize == 1)
			emit_binary_func_op(result_type, id, args[0], args[1], "spvReflect");
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Refract:
		if (get<SPIRType>(result_type).vecsize == 1)
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "spvRefract");
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450FaceForward:
		if (get<SPIRType>(result_type).vecsize == 1)
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "spvFaceForward");
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Modf:
	case GLSLstd450Frexp:
	{
		// Special case. If the variable is a scalar access chain, we cannot use it directly. We have to emit a temporary.
		// Another special case is if the variable is in a storage class which is not thread.
		auto *ptr = maybe_get<SPIRExpression>(args[1]);
		auto &type = expression_type(args[1]);

		bool is_thread_storage = storage_class_array_is_thread(type.storage);
		if (type.storage == StorageClassOutput && capture_output_to_buffer)
			is_thread_storage = false;

		if (!is_thread_storage ||
		    (ptr && ptr->access_chain && is_scalar(expression_type(args[1]))))
		{
			register_call_out_argument(args[1]);
			forced_temporaries.insert(id);

			// Need to create temporaries and copy over to access chain after.
			// We cannot directly take the reference of a vector swizzle in MSL, even if it's scalar ...
			uint32_t &tmp_id = extra_sub_expressions[id];
			if (!tmp_id)
				tmp_id = ir.increase_bound_by(1);

			uint32_t tmp_type_id = get_pointee_type_id(expression_type_id(args[1]));
			emit_uninitialized_temporary_expression(tmp_type_id, tmp_id);
			emit_binary_func_op(result_type, id, args[0], tmp_id, eop == GLSLstd450Modf ? "modf" : "frexp");
			statement(to_expression(args[1]), " = ", to_expression(tmp_id), ";");
		}
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;
	}

	default:
		CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;
	}
}